

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_computeOverlapSize(ZSTD_CCtx_params *params)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t local_38;
  bool local_29;
  uint local_28;
  bool local_1d;
  uint local_1c;
  uint local_18;
  int ovLog;
  int overlapRLog;
  ZSTD_CCtx_params *params_local;
  
  iVar2 = ZSTDMT_overlapLog(params->overlapLog,(params->cParams).strategy);
  uVar3 = 9 - iVar2;
  if ((int)uVar3 < 8) {
    local_1c = (params->cParams).windowLog - uVar3;
  }
  else {
    local_1c = 0;
  }
  local_18 = local_1c;
  local_1d = 8 < uVar3;
  if (local_1d) {
    __assert_fail("0 <= overlapRLog && overlapRLog <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4f1d,"size_t ZSTDMT_computeOverlapSize(const ZSTD_CCtx_params *)");
  }
  if ((params->ldmParams).enableLdm != 0) {
    uVar1 = (params->cParams).windowLog;
    uVar4 = ZSTDMT_computeTargetJobLog(params);
    if (uVar1 < uVar4 - 2) {
      local_28 = (params->cParams).windowLog;
    }
    else {
      local_28 = ZSTDMT_computeTargetJobLog(params);
      local_28 = local_28 - 2;
    }
    local_18 = local_28 - uVar3;
  }
  local_29 = 0x1f < local_18;
  if (local_29) {
    __assert_fail("0 <= ovLog && ovLog <= ZSTD_WINDOWLOG_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4f26,"size_t ZSTDMT_computeOverlapSize(const ZSTD_CCtx_params *)");
  }
  if (local_18 == 0) {
    local_38 = 0;
  }
  else {
    local_38 = 1L << ((byte)local_18 & 0x3f);
  }
  return local_38;
}

Assistant:

static size_t ZSTDMT_computeOverlapSize(const ZSTD_CCtx_params* params)
{
    int const overlapRLog = 9 - ZSTDMT_overlapLog(params->overlapLog, params->cParams.strategy);
    int ovLog = (overlapRLog >= 8) ? 0 : (params->cParams.windowLog - overlapRLog);
    assert(0 <= overlapRLog && overlapRLog <= 8);
    if (params->ldmParams.enableLdm) {
        /* In Long Range Mode, the windowLog is typically oversized.
         * In which case, it's preferable to determine the jobSize
         * based on chainLog instead.
         * Then, ovLog becomes a fraction of the jobSize, rather than windowSize */
        ovLog = MIN(params->cParams.windowLog, ZSTDMT_computeTargetJobLog(params) - 2)
                - overlapRLog;
    }
    assert(0 <= ovLog && ovLog <= ZSTD_WINDOWLOG_MAX);
    DEBUGLOG(4, "overlapLog : %i", params->overlapLog);
    DEBUGLOG(4, "overlap size : %i", 1 << ovLog);
    return (ovLog==0) ? 0 : (size_t)1 << ovLog;
}